

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.c
# Opt level: O1

void decode_module(wasm_reader *wr,module *m)

{
  byte bVar1;
  byte bVar2;
  module *__ptr;
  wasm_reader *pwVar3;
  long lVar4;
  
  (*(wr->wr_op).open)(wr,m->bin);
  __ptr = m;
  get_magic_version_num(wr,m);
  m->custom_segment_count = 0;
  m->custom_sec = (custom_segment *)0x0;
  bVar2 = 1;
  while( true ) {
    pwVar3 = wr;
    bVar1 = (*(wr->wr_op).read_byte)(wr);
    if ((bVar1 != 0) && ((0xb < bVar1 || (bVar1 < bVar2)))) break;
    __ptr = m;
    (*wr->decode_segment[bVar1])(wr,m);
    bVar2 = bVar1 + 1;
    if (wr->model_size <= wr->index) {
      return;
    }
  }
  decode_module_cold_1();
  lVar4 = 0x16;
  do {
    (*(code *)(&pwVar3->wasm_model_addr)[lVar4])(pwVar3,__ptr);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x22);
  free(__ptr);
  return;
}

Assistant:

void decode_module(wasm_reader *wr, module *m) {
    byte secID;
    byte current_secID = type_segment_id;
    wr->wr_op.open(wr, m->bin);
    get_magic_version_num(wr, m);
    m->custom_segment_count = 0;
    m->custom_sec = NULL;
    while (true) {
        secID = wr->wr_op.read_byte(wr);
        if (secID != custom_segment_id && secID < current_secID || secID >= segment_count) {
            errorExit("secID get wrong\n");
        }
        wr->decode_segment[secID](wr, m);
        current_secID = secID + 1;
        if (wr->index >= wr->model_size)
            break;
    }
}